

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# siphash.cc
# Opt level: O1

uint64_t SIPHASH_24(uint64_t *key,uint8_t *input,size_t input_len)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint8_t last_block [8];
  ulong local_30;
  
  uVar3 = *key ^ 0x736f6d6570736575;
  uVar4 = key[1] ^ 0x646f72616e646f6d;
  uVar6 = *key ^ 0x6c7967656e657261;
  uVar2 = key[1] ^ 0x7465646279746573;
  uVar1 = input_len;
  if (7 < input_len) {
    do {
      uVar2 = uVar2 ^ *(ulong *)input;
      uVar3 = uVar3 + uVar4;
      uVar5 = (uVar4 << 0xd | uVar4 >> 0x33) ^ uVar3;
      uVar4 = (uVar2 << 0x10 | uVar2 >> 0x30) ^ uVar6 + uVar2;
      uVar7 = uVar6 + uVar2 + uVar5;
      uVar3 = (uVar3 << 0x20 | uVar3 >> 0x20) + uVar4;
      uVar6 = (uVar5 << 0x11 | uVar5 >> 0x2f) ^ uVar7;
      uVar2 = (uVar4 << 0x15 | uVar4 >> 0x2b) ^ uVar3;
      uVar3 = uVar3 + uVar6;
      uVar5 = (uVar7 << 0x20 | uVar7 >> 0x20) + uVar2;
      uVar4 = (uVar6 << 0xd | uVar6 >> 0x33) ^ uVar3;
      uVar2 = (uVar2 << 0x10 | uVar2 >> 0x30) ^ uVar5;
      uVar5 = uVar5 + uVar4;
      uVar3 = (uVar3 << 0x20 | uVar3 >> 0x20) + uVar2;
      uVar4 = (uVar4 << 0x11 | uVar4 >> 0x2f) ^ uVar5;
      uVar2 = (uVar2 << 0x15 | uVar2 >> 0x2b) ^ uVar3;
      uVar6 = uVar5 << 0x20 | uVar5 >> 0x20;
      uVar3 = uVar3 ^ *(ulong *)input;
      input = (uint8_t *)((long)input + 8);
      uVar1 = uVar1 - 8;
    } while (7 < uVar1);
  }
  local_30 = 0;
  if (uVar1 == 0) {
    local_30 = input_len << 0x38;
    uVar3 = uVar3 + uVar4;
    uVar6 = uVar6 + (uVar2 ^ local_30);
    uVar4 = (uVar4 << 0xd | uVar4 >> 0x33) ^ uVar3;
    uVar1 = (uVar2 << 0x10 | (uVar2 ^ local_30) >> 0x30) ^ uVar6;
    uVar6 = uVar6 + uVar4;
    uVar2 = (uVar3 << 0x20 | uVar3 >> 0x20) + uVar1;
    uVar3 = (uVar4 << 0x11 | uVar4 >> 0x2f) ^ uVar6;
    uVar1 = (uVar1 << 0x15 | uVar1 >> 0x2b) ^ uVar2;
    uVar2 = uVar2 + uVar3;
    uVar4 = (uVar6 << 0x20 | uVar6 >> 0x20) + uVar1;
    uVar3 = (uVar3 << 0xd | uVar3 >> 0x33) ^ uVar2;
    uVar1 = (uVar1 << 0x10 | uVar1 >> 0x30) ^ uVar4;
    uVar4 = uVar4 + uVar3;
    uVar2 = (uVar2 << 0x20 | uVar2 >> 0x20) + uVar1;
    uVar3 = (uVar3 << 0x11 | uVar3 >> 0x2f) ^ uVar4;
    uVar1 = (uVar1 << 0x15 | uVar1 >> 0x2b) ^ uVar2;
    uVar2 = (uVar2 ^ local_30) + uVar3;
    uVar4 = ((uVar4 << 0x20 | uVar4 >> 0x20) ^ 0xff) + uVar1;
    uVar3 = (uVar3 << 0xd | uVar3 >> 0x33) ^ uVar2;
    uVar1 = (uVar1 << 0x10 | uVar1 >> 0x30) ^ uVar4;
    uVar4 = uVar4 + uVar3;
    uVar2 = (uVar2 << 0x20 | uVar2 >> 0x20) + uVar1;
    uVar3 = (uVar3 << 0x11 | uVar3 >> 0x2f) ^ uVar4;
    uVar1 = (uVar1 << 0x15 | uVar1 >> 0x2b) ^ uVar2;
    uVar2 = uVar2 + uVar3;
    uVar4 = (uVar4 << 0x20 | uVar4 >> 0x20) + uVar1;
    uVar3 = (uVar3 << 0xd | uVar3 >> 0x33) ^ uVar2;
    uVar1 = (uVar1 << 0x10 | uVar1 >> 0x30) ^ uVar4;
    uVar4 = uVar4 + uVar3;
    uVar2 = (uVar2 << 0x20 | uVar2 >> 0x20) + uVar1;
    uVar3 = (uVar3 << 0x11 | uVar3 >> 0x2f) ^ uVar4;
    uVar1 = (uVar1 << 0x15 | uVar1 >> 0x2b) ^ uVar2;
    uVar2 = uVar2 + uVar3;
    uVar4 = (uVar4 << 0x20 | uVar4 >> 0x20) + uVar1;
    uVar3 = (uVar3 << 0xd | uVar3 >> 0x33) ^ uVar2;
    uVar1 = (uVar1 << 0x10 | uVar1 >> 0x30) ^ uVar4;
    uVar4 = uVar4 + uVar3;
    uVar2 = (uVar2 << 0x20 | uVar2 >> 0x20) + uVar1;
    uVar3 = (uVar3 << 0x11 | uVar3 >> 0x2f) ^ uVar4;
    uVar1 = (uVar1 << 0x15 | uVar1 >> 0x2b) ^ uVar2;
    uVar4 = (uVar4 << 0x20 | uVar4 >> 0x20) + uVar1;
    uVar2 = (uVar3 << 0xd | uVar3 >> 0x33) ^ uVar2 + uVar3;
    uVar1 = (uVar1 << 0x10 | uVar1 >> 0x30) ^ uVar4;
    uVar4 = uVar4 + uVar2;
    return (uVar4 << 0x20 | uVar4 >> 0x20) ^ uVar4 ^
           (uVar1 << 0x15 | uVar1 >> 0x2b) ^ (uVar2 << 0x11 | uVar2 >> 0x2f);
  }
  memcpy(&local_30,input,uVar1);
}

Assistant:

uint64_t SIPHASH_24(const uint64_t key[2], const uint8_t *input,
                    size_t input_len) {
  const size_t orig_input_len = input_len;

  uint64_t v[4];
  v[0] = key[0] ^ UINT64_C(0x736f6d6570736575);
  v[1] = key[1] ^ UINT64_C(0x646f72616e646f6d);
  v[2] = key[0] ^ UINT64_C(0x6c7967656e657261);
  v[3] = key[1] ^ UINT64_C(0x7465646279746573);

  while (input_len >= sizeof(uint64_t)) {
    uint64_t m = CRYPTO_load_u64_le(input);
    v[3] ^= m;
    siphash_round(v);
    siphash_round(v);
    v[0] ^= m;

    input += sizeof(uint64_t);
    input_len -= sizeof(uint64_t);
  }

  uint8_t last_block[8];
  OPENSSL_memset(last_block, 0, sizeof(last_block));
  OPENSSL_memcpy(last_block, input, input_len);
  last_block[7] = orig_input_len & 0xff;

  uint64_t last_block_word = CRYPTO_load_u64_le(last_block);
  v[3] ^= last_block_word;
  siphash_round(v);
  siphash_round(v);
  v[0] ^= last_block_word;

  v[2] ^= 0xff;
  siphash_round(v);
  siphash_round(v);
  siphash_round(v);
  siphash_round(v);

  return v[0] ^ v[1] ^ v[2] ^ v[3];
}